

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
try_handle_next_demand
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,unique_lock<std::mutex> *acquired_lock)

{
  timer_manager_t *ptVar1;
  pop_result_t pVar2;
  int iVar3;
  undefined4 extraout_var;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_mtsafe_st_env_infrastructure_cpp:761:7)>
  work_tracking_stopper;
  duration sleep_time;
  execution_demand_t demand;
  at_exit_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_simple_mtsafe_st_env_infrastructure_cpp:761:7)>
  local_70;
  anon_class_16_2_3941ba46 local_68;
  execution_demand_t local_58;
  
  local_58.m_mbox_id = 0;
  local_58.m_receiver = (agent_t *)0x0;
  local_58.m_limit = (control_block_t *)0x0;
  local_58.m_msg_type._M_target = (type_info *)&void::typeinfo;
  local_58.m_message_ref.m_obj = (message_t *)0x0;
  local_58.m_demand_handler = (demand_handler_pfn_t)0x0;
  pVar2 = event_queue_impl_t::pop(&this->m_event_queue,&local_58);
  if (pVar2 == empty_queue) {
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::start_if_not_started
              (&(this->m_activity_tracker).m_waiting);
    ptVar1 = (this->m_timer_manager)._M_t.
             super___uniq_ptr_impl<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::timer_manager_t_*,_std::default_delete<so_5::timer_manager_t>_>
             .super__Head_base<0UL,_so_5::timer_manager_t_*,_false>._M_head_impl;
    iVar3 = (*ptVar1->_vptr_timer_manager_t[3])(ptVar1,60000000000);
    local_68.this =
         (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
          *)CONCAT44(extraout_var,iVar3);
    (this->m_sync_objects).m_status = waiting;
    std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
              (&(this->m_sync_objects).m_wakeup_condition,acquired_lock,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&local_68);
    (this->m_sync_objects).m_status = working;
  }
  else {
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
              (&(this->m_activity_tracker).m_waiting);
    stats::activity_tracking_stuff::
    stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::do_start
              (&(this->m_activity_tracker).m_working);
    local_70.m_lambda.this =
         (anon_class_8_1_8991fb9c_for_m_lambda_conflict)
         (anon_class_8_1_8991fb9c_for_m_lambda_conflict)this;
    local_68.this = this;
    local_68.demand = &local_58;
    helpers::
    unlock_do_and_lock_again<so_5::env_infrastructures::simple_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::try_handle_next_demand(std::unique_lock<std::mutex>&)::_lambda()_2_>
              (acquired_lock,&local_68);
    details::scope_exit_details::
    at_exit_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/simple_mtsafe_st_env_infrastructure.cpp:761:7)>
    ::~at_exit_t(&local_70);
  }
  intrusive_ptr_t<so_5::message_t>::~intrusive_ptr_t(&local_58.m_message_ref);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::try_handle_next_demand(
	std::unique_lock< std::mutex > & acquired_lock )
	{
		execution_demand_t demand;
		const auto pop_result = m_event_queue.pop( demand );
		// If there is no demands we must go to sleep for some time...
		if( event_queue_impl_t::pop_result_t::empty_queue == pop_result )
			{
				// Tracking time for 'waiting' state must be turned on.
				m_activity_tracker.wait_start_if_not_started();

				const auto sleep_time =
						m_timer_manager->timeout_before_nearest_timer(
								std::chrono::minutes(1) );

				m_sync_objects.m_status = main_thread_status_t::waiting;

				m_sync_objects.m_wakeup_condition.wait_for(
						acquired_lock,
						sleep_time );

				m_sync_objects.m_status = main_thread_status_t::working;
			}
		else
			{
				// Tracking time for 'waiting' must be turned off, but
				// tracking time for 'working' must be tuned on and then off again.
				m_activity_tracker.wait_stopped();
				m_activity_tracker.work_started();
				auto work_tracking_stopper = so_5::details::at_scope_exit(
						[this]{ m_activity_tracker.work_stopped(); } );

				// There is at least one demand to process.
				helpers::unlock_do_and_lock_again( acquired_lock,
					[this, &demand] {
						m_default_disp.handle_demand( demand );
					} );
			}
	}